

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImVec2 InputTextCalcTextSizeW
                 (ImWchar *text_begin,ImWchar *text_end,ImWchar **remaining,ImVec2 *out_offset,
                 bool stop_on_new_line)

{
  float fVar1;
  ushort uVar2;
  ImFont *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  float *pfVar7;
  ImVec2 IVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  
  pIVar3 = GImGui->Font;
  fVar1 = GImGui->FontSize;
  auVar12 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar10 = ZEXT1664(ZEXT816(0) << 0x40);
  do {
    auVar9 = auVar10._0_16_;
    auVar11 = auVar12._0_16_;
    if (text_end <= text_begin) break;
    uVar2 = *text_begin;
    if (uVar2 == 0xd) {
LAB_00175885:
      cVar6 = '\0';
    }
    else {
      if (uVar2 != 10) {
        pfVar7 = (float *)((ulong)((uint)uVar2 * 4) + (long)(pIVar3->IndexAdvanceX).Data);
        if ((pIVar3->IndexAdvanceX).Size <= (int)(uint)uVar2) {
          pfVar7 = &pIVar3->FallbackAdvanceX;
        }
        auVar12 = ZEXT464((uint)(auVar12._0_4_ + (fVar1 / pIVar3->FontSize) * *pfVar7));
        goto LAB_00175885;
      }
      auVar4 = vcmpss_avx(auVar11,auVar9,2);
      auVar11 = vblendvps_avx(auVar11,auVar9,auVar4);
      auVar9 = vmovshdup_avx(auVar9);
      auVar9 = vinsertps_avx(auVar11,ZEXT416((uint)(fVar1 + auVar9._0_4_)),0x1c);
      auVar10 = ZEXT1664(auVar9);
      auVar12 = ZEXT864(0) << 0x20;
      cVar6 = (char)out_offset;
    }
    auVar9 = auVar10._0_16_;
    auVar11 = auVar12._0_16_;
    text_begin = text_begin + 1;
  } while (cVar6 == '\0');
  if (remaining != (ImWchar **)0x0) {
    *remaining = text_begin;
  }
  if (auVar9._0_4_ < auVar11._0_4_) {
    auVar9._0_4_ = auVar11._0_4_;
  }
  IVar8 = auVar9._0_8_;
  auVar5 = vmovshdup_avx(auVar9);
  auVar4 = vcmpps_avx(auVar5,ZEXT816(0) << 0x40,0);
  auVar11 = vcmpps_avx(ZEXT816(0) << 0x40,auVar11,1);
  auVar11 = vorps_avx(auVar11,auVar4);
  if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar1 + auVar5._0_4_)),0x10);
    IVar8 = auVar9._0_8_;
  }
  return IVar8;
}

Assistant:

static ImVec2 InputTextCalcTextSizeW(const ImWchar* text_begin, const ImWchar* text_end, const ImWchar** remaining, ImVec2* out_offset, bool stop_on_new_line)
{
    ImGuiContext& g = *GImGui;
    ImFont* font = g.Font;
    const float line_height = g.FontSize;
    const float scale = line_height / font->FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const ImWchar* s = text_begin;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)(*s++);
        if (c == '\n')
        {
            text_size.x = ImMax(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0.0f;
            if (stop_on_new_line)
                break;
            continue;
        }
        if (c == '\r')
            continue;

        const float char_width = font->GetCharAdvance((ImWchar)c) * scale;
        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (out_offset)
        *out_offset = ImVec2(line_width, text_size.y + line_height);  // offset allow for the possibility of sitting after a trailing \n

    if (line_width > 0 || text_size.y == 0.0f)                        // whereas size.y will ignore the trailing \n
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}